

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O2

int __thiscall Fl_Counter::calc_mouseobj(Fl_Counter *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  if ((this->super_Fl_Valuator).super_Fl_Widget.type_ == '\0') {
    iVar2 = (iVar2 * 0xf) / 100;
    iVar3 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_,
                             (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                             (this->super_Fl_Valuator).super_Fl_Widget.h_);
    if (iVar3 != 0) {
      return 1;
    }
    iVar3 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar2,
                             (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                             (this->super_Fl_Valuator).super_Fl_Widget.h_);
    if (iVar3 == 0) {
      iVar3 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_ + iVar2 * -2 +
                               (this->super_Fl_Valuator).super_Fl_Widget.w_,
                               (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                               (this->super_Fl_Valuator).super_Fl_Widget.h_);
      if (iVar3 != 0) {
        return 3;
      }
      uVar1 = 4;
      goto LAB_001aa66e;
    }
  }
  else {
    iVar2 = iVar2 / 5;
    iVar3 = Fl::event_inside((this->super_Fl_Valuator).super_Fl_Widget.x_,
                             (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                             (this->super_Fl_Valuator).super_Fl_Widget.h_);
    if (iVar3 == 0) {
      uVar1 = 3;
LAB_001aa66e:
      iVar2 = Fl::event_inside(((this->super_Fl_Valuator).super_Fl_Widget.x_ - iVar2) +
                               (this->super_Fl_Valuator).super_Fl_Widget.w_,
                               (this->super_Fl_Valuator).super_Fl_Widget.y_,iVar2,
                               (this->super_Fl_Valuator).super_Fl_Widget.h_);
      return -(uint)(iVar2 == 0) | uVar1;
    }
  }
  return 2;
}

Assistant:

int Fl_Counter::calc_mouseobj() {
  if (type() == FL_NORMAL_COUNTER) {
    int W = w()*15/100;
    if (Fl::event_inside(x(), y(), W, h())) return 1;
    if (Fl::event_inside(x()+W, y(), W, h())) return 2;
    if (Fl::event_inside(x()+w()-2*W, y(), W, h())) return 3;
    if (Fl::event_inside(x()+w()-W, y(), W, h())) return 4;
  } else {
    int W = w()*20/100;
    if (Fl::event_inside(x(), y(), W, h())) return 2;
    if (Fl::event_inside(x()+w()-W, y(), W, h())) return 3;
  }
  return -1;
}